

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<QString,QFont>::tryEmplace_impl<QString_const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,QString *key)

{
  uchar uVar1;
  Span *pSVar2;
  Data *pDVar3;
  Data<QHashPrivate::Node<QString,_QFont>_> *pDVar4;
  size_t hash;
  Node<QString,_QFont> *pNVar6;
  long in_FS_OFFSET;
  Bucket BVar8;
  QStringView QVar9;
  QHash<QString,_QFont> local_40;
  long local_38;
  Span *pSVar5;
  ulong uVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = *this;
  if (pDVar4 == (Data<QHashPrivate::Node<QString,_QFont>_> *)0x0) {
    pDVar4 = QHashPrivate::Data<QHashPrivate::Node<QString,_QFont>_>::detached
                       ((Data<QHashPrivate::Node<QString,_QFont>_> *)0x0);
    *(Data<QHashPrivate::Node<QString,_QFont>_> **)this = pDVar4;
  }
  local_40.d = (Data *)0x0;
  QVar9.m_data = (key->d).ptr;
  QVar9.m_size = (key->d).size;
  hash = qHash(QVar9,pDVar4->seed);
  BVar8 = QHashPrivate::Data<QHashPrivate::Node<QString,_QFont>_>::findBucketWithHash<QString>
                    (pDVar4,key,hash);
  uVar7 = BVar8.index;
  pSVar5 = BVar8.span;
  uVar1 = pSVar5->offsets[uVar7];
  pDVar4 = *this;
  if ((pDVar4 == (Data<QHashPrivate::Node<QString,_QFont>_> *)0x0) ||
     (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    QHash<QString,_QFont>::operator=(&local_40,(QHash<QString,_QFont> *)this);
    if (uVar1 == 0xff) {
LAB_004095d3:
      pDVar4 = *this;
      if (pDVar4->numBuckets >> 1 <= pDVar4->size) {
        pDVar4 = QHashPrivate::Data<QHashPrivate::Node<QString,_QFont>_>::detached
                           (pDVar4,pDVar4->size + 1);
        *(Data<QHashPrivate::Node<QString,_QFont>_> **)this = pDVar4;
        BVar8 = QHashPrivate::Data<QHashPrivate::Node<QString,_QFont>_>::findBucketWithHash<QString>
                          (pDVar4,key,hash);
        goto LAB_00409650;
      }
    }
    else {
      pDVar4 = *this;
    }
    pSVar2 = pDVar4->spans;
    pDVar4 = QHashPrivate::Data<QHashPrivate::Node<QString,_QFont>_>::detached(pDVar4);
    *(Data<QHashPrivate::Node<QString,_QFont>_> **)this = pDVar4;
    BVar8.index._0_4_ = (uint)BVar8.index & 0x7f;
    BVar8.span = pDVar4->spans +
                 ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar7) >> 7);
    BVar8.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_0040968c;
  }
  else {
    if (uVar1 != 0xff) goto LAB_0040968c;
    if (pDVar4->numBuckets >> 1 <= pDVar4->size) {
      QHash<QString,_QFont>::operator=(&local_40,(QHash<QString,_QFont> *)this);
      goto LAB_004095d3;
    }
  }
LAB_00409650:
  pNVar6 = QHashPrivate::Span<QHashPrivate::Node<QString,_QFont>_>::insert(BVar8.span,BVar8.index);
  pDVar3 = (key->d).d;
  (pNVar6->key).d.d = pDVar3;
  (pNVar6->key).d.ptr = (key->d).ptr;
  (pNVar6->key).d.size = (key->d).size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QFont::QFont(&pNVar6->value);
  pDVar4 = *this;
  pDVar4->size = pDVar4->size + 1;
LAB_0040968c:
  pSVar5 = pDVar4->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar4;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar8.span - (long)pSVar5) >> 4) * 0x1c71c71c71c71c80 | BVar8.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QString,_QFont>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }